

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execShiftRg<(moira::Core)0,(moira::Instr)95,(moira::Mode)0,1>(Moira *this,u16 opcode)

{
  u32 uVar1;
  u32 uVar2;
  int cyc;
  int cnt;
  int dst;
  int src;
  u16 opcode_local;
  Moira *this_local;
  
  uVar1 = readD<4>(this,(int)(uint)opcode >> 9 & 7);
  prefetch<(moira::Core)0,4ull>(this);
  uVar2 = readD<1>(this,opcode & 7);
  uVar2 = shift<(moira::Core)0,(moira::Instr)95,1>(this,uVar1 & 0x3f,(ulong)uVar2);
  writeD<1>(this,opcode & 7,uVar2);
  (*this->_vptr_Moira[2])(this,(ulong)((uVar1 & 0x3f) * 2 + 6));
  return;
}

Assistant:

void
Moira::execShiftRg(u16 opcode)
{
    AVAILABILITY(Core::C68000)

    int src = ____xxx_________(opcode);
    int dst = _____________xxx(opcode);

    int cnt = readD(src) & 0x3F;
    int cyc = (S == Long ? 4 : 2) + 2 * cnt;

    prefetch<C, POLL>();
    SYNC(cyc);

    writeD<S>(dst, shift<C, I, S>(cnt, readD<S>(dst)));

    if constexpr (C == Core::C68000 || C == Core::C68010) {

        CYCLES(4 + cyc);

    } else {

        switch (I) {

            case Instr::ROL:
            case Instr::ROR:
            case Instr::ASL:
                
                CYCLES(  8 + cnt );
                break;
                
            case Instr::ROXL:
            case Instr::ROXR:
                
                CYCLES( 12 + cnt );
                break;
                
            default:
                
                CYCLES(  6 + cnt );
                break;
        }
    }

    FINALIZE
}